

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O3

void __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::reactive_socket_service
          (reactive_socket_service<asio::ip::udp> *this,execution_context *context)

{
  reactor *prVar1;
  error_category *peVar2;
  key local_20;
  
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service.key_.type_info_ = (type_info *)0x0;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service.key_.id_ = (id *)0x0;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service.owner_ = context;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service.next_ = (service *)0x0;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service._vptr_service = (_func_int **)&PTR__noncopyable_0053bae8;
  local_20.type_info_ = (type_info *)&typeid_wrapper<asio::detail::epoll_reactor>::typeinfo;
  local_20.id_ = (id *)0x0;
  prVar1 = (reactor *)
           service_registry::do_use_service
                     ((service_registry *)context->service_registry_,&local_20,
                      service_registry::create<asio::detail::epoll_reactor,asio::execution_context>,
                      context->service_registry_->owner_);
  (this->super_reactive_socket_service_base).reactor_ = prVar1;
  (this->super_reactive_socket_service_base).success_ec_._M_value = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  (this->super_reactive_socket_service_base).success_ec_._M_cat = peVar2;
  scheduler::init_task((scheduler *)prVar1->scheduler_);
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service._vptr_service = (_func_int **)&PTR__noncopyable_0053ba20;
  return;
}

Assistant:

reactive_socket_service(execution_context& context)
    : execution_context_service_base<
        reactive_socket_service<Protocol>>(context),
      reactive_socket_service_base(context)
  {
  }